

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<(anonymous_namespace)::QDnsCachedName>::emplace<QString,long_long&>
          (QMovableArrayOps<(anonymous_namespace)::QDnsCachedName> *this,qsizetype i,QString *args,
          longlong *args_1)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RCX;
  undefined8 in_RDX;
  QDnsCachedName *in_RSI;
  Inserter *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QDnsCachedName tmp;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined1 in_stack_ffffffffffffff8e;
  byte bVar6;
  GrowthPosition where;
  Inserter local_50;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::needsDetach
                    ((QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->displaceTo) &&
       (qVar3 = QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::freeSpaceAtEnd
                          ((QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                   CONCAT24(in_stack_ffffffffffffff8c,
                                                            in_stack_ffffffffffffff88)))),
       qVar3 != 0)) {
      QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::end
                ((QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)in_RDI);
      anon_unknown.dwarf_8d754d::QDnsCachedName::QDnsCachedName
                ((QDnsCachedName *)in_RCX,
                 (QString *)
                 CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                         CONCAT24(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88))),
                 (int)((ulong)in_RDI >> 0x20));
      in_RDI->displaceTo = (QDnsCachedName *)((long)&(in_RDI->displaceTo->name).d.d + 1);
      goto LAB_00363663;
    }
    if ((in_RSI == (QDnsCachedName *)0x0) &&
       (qVar3 = QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::freeSpaceAtBegin
                          ((QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                                   CONCAT24(in_stack_ffffffffffffff8c,
                                                            in_stack_ffffffffffffff88)))),
       qVar3 != 0)) {
      QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::begin
                ((QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)0x363505);
      anon_unknown.dwarf_8d754d::QDnsCachedName::QDnsCachedName
                ((QDnsCachedName *)in_RCX,
                 (QString *)
                 CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                         CONCAT24(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88))),
                 (int)((ulong)in_RDI >> 0x20));
      in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
      in_RDI->displaceTo = (QDnsCachedName *)((long)&(in_RDI->displaceTo->name).d.d + 1);
      goto LAB_00363663;
    }
  }
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_8d754d::QDnsCachedName::QDnsCachedName
            ((QDnsCachedName *)in_RCX,
             (QString *)
             CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff8e,
                                     CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)))
             ,(int)((ulong)in_RDI >> 0x20));
  bVar4 = in_RDI->displaceTo != (QDnsCachedName *)0x0;
  uVar5 = bVar4 && in_RSI == (QDnsCachedName *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QDnsCachedName *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::detachAndGrow
            ((QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)in_RSI,where,
             (qsizetype)in_RCX,
             (QDnsCachedName **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff8c,uVar2))),
             (QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(in_RCX,(QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)
                              CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff8c,uVar2
                                                                    ))),(qsizetype)in_RDI,
                       CONCAT17(uVar5,in_stack_ffffffffffffff78));
    Inserter::insertOne(in_RDI,(QDnsCachedName *)CONCAT17(uVar5,in_stack_ffffffffffffff78));
    Inserter::~Inserter(&local_50);
  }
  else {
    QArrayDataPointer<(anonymous_namespace)::QDnsCachedName>::begin
              ((QArrayDataPointer<(anonymous_namespace)::QDnsCachedName> *)0x3635f7);
    anon_unknown.dwarf_8d754d::QDnsCachedName::QDnsCachedName
              ((QDnsCachedName *)in_RDI,(QDnsCachedName *)CONCAT17(uVar5,in_stack_ffffffffffffff78))
    ;
    in_RDI->displaceFrom = in_RDI->displaceFrom + -1;
    in_RDI->displaceTo = (QDnsCachedName *)((long)&(in_RDI->displaceTo->name).d.d + 1);
  }
  anon_unknown.dwarf_8d754d::QDnsCachedName::~QDnsCachedName((QDnsCachedName *)0x363663);
LAB_00363663:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }